

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * Lowerer::InsertAdd(bool needFlags,Opnd *dst,Opnd *src1,Opnd *src2,Instr *insertBeforeInstr)

{
  Func *func;
  long lVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IntConstOpnd *pIVar5;
  Instr *pIVar6;
  Opnd *newSrc1;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3e50,"(dst)","dst");
    if (!bVar3) goto LAB_0055ba07;
    *puVar4 = 0;
  }
  if (src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3e51,"(src1)","src1");
    if (!bVar3) goto LAB_0055ba07;
    *puVar4 = 0;
  }
  if (src2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3e52,"(src2)","src2");
    if (!bVar3) goto LAB_0055ba07;
    *puVar4 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3e53,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) {
LAB_0055ba07:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  func = insertBeforeInstr->m_func;
  bVar3 = IR::Opnd::IsIntConstOpnd(src2);
  if (bVar3) {
    pIVar5 = IR::Opnd::AsIntConstOpnd(src2);
    lVar1 = (pIVar5->super_EncodableOpnd<long>).m_value;
    if (lVar1 != -0x80000000 && lVar1 < 0) {
      pIVar5 = IR::IntConstOpnd::CopyInternal(pIVar5,func);
      IR::IntConstOpnd::SetValue(pIVar5,-lVar1);
LAB_0055b9ed:
      pIVar6 = InsertSub(needFlags,dst,src1,&pIVar5->super_Opnd,insertBeforeInstr);
      return pIVar6;
    }
  }
  else {
    bVar3 = IR::Opnd::IsIntConstOpnd(src1);
    if (bVar3) {
      pIVar5 = IR::Opnd::AsIntConstOpnd(src1);
      lVar1 = (pIVar5->super_EncodableOpnd<long>).m_value;
      if (lVar1 != -0x80000000 && lVar1 < 0) {
        pIVar5 = IR::IntConstOpnd::CopyInternal(pIVar5,func);
        IR::IntConstOpnd::SetValue(pIVar5,-lVar1);
        src1 = src2;
        goto LAB_0055b9ed;
      }
    }
  }
  pIVar6 = IR::Instr::New(Add_A,dst,src1,src2,func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar6);
  LowererMD::ChangeToAdd(pIVar6,needFlags);
  LowererMD::Legalize<false>(pIVar6,false);
  return pIVar6;
}

Assistant:

IR::Instr *Lowerer::InsertAdd(
    const bool needFlags,
    IR::Opnd *const dst,
    IR::Opnd *src1,
    IR::Opnd *src2,
    IR::Instr *const insertBeforeInstr)
{
    Assert(dst);
    Assert(src1);
    Assert(src2);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    if(src2->IsIntConstOpnd())
    {
        IR::IntConstOpnd *const intConstOpnd = src2->AsIntConstOpnd();
        const IntConstType value = intConstOpnd->GetValue();
        if(value < 0 && value != IntConstMin)
        {
            // Change (s1 = s1 + -5) into (s1 = s1 - 5)
            IR::IntConstOpnd *const newSrc2 = intConstOpnd->CopyInternal(func);
            newSrc2->SetValue(-value);
            return InsertSub(needFlags, dst, src1, newSrc2, insertBeforeInstr);
        }
    }
    else if(src1->IsIntConstOpnd())
    {
        IR::IntConstOpnd *const intConstOpnd = src1->AsIntConstOpnd();
        const IntConstType value = intConstOpnd->GetValue();
        if(value < 0 && value != IntConstMin)
        {
            // Change (s1 = -5 + s1) into (s1 = s1 - 5)
            IR::Opnd *const newSrc1 = src2;
            IR::IntConstOpnd *const newSrc2 = intConstOpnd->CopyInternal(func);
            newSrc2->SetValue(-value);
            return InsertSub(needFlags, dst, newSrc1, newSrc2, insertBeforeInstr);
        }
    }

    IR::Instr *const instr = IR::Instr::New(Js::OpCode::Add_A, dst, src1, src2, func);

    insertBeforeInstr->InsertBefore(instr);
    LowererMD::ChangeToAdd(instr, needFlags);
    LowererMD::Legalize(instr);
    return instr;
}